

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

bool __thiscall
libcellml::Analyser::addExternalVariable
          (Analyser *this,AnalyserExternalVariablePtr *externalVariable)

{
  pointer puVar1;
  shared_ptr<libcellml::AnalyserExternalVariable> *psVar2;
  LoggerImpl *pLVar3;
  __normal_iterator<std::shared_ptr<libcellml::AnalyserExternalVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>_>
  _Var4;
  
  pLVar3 = Logger::pFunc(&this->super_Logger);
  puVar1 = pLVar3[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar3 = Logger::pFunc(&this->super_Logger);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::AnalyserExternalVariable>*,std::vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<libcellml::AnalyserExternalVariable>const>>
                    (puVar1,pLVar3[1].mWarnings.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish,externalVariable);
  pLVar3 = Logger::pFunc(&this->super_Logger);
  psVar2 = (shared_ptr<libcellml::AnalyserExternalVariable> *)
           pLVar3[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current == psVar2) {
    pLVar3 = Logger::pFunc(&this->super_Logger);
    std::
    vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
    ::push_back((vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
                 *)&pLVar3[1].mWarnings,externalVariable);
  }
  return _Var4._M_current == psVar2;
}

Assistant:

bool Analyser::addExternalVariable(const AnalyserExternalVariablePtr &externalVariable)
{
    if (std::find(pFunc()->mExternalVariables.begin(), pFunc()->mExternalVariables.end(), externalVariable) == pFunc()->mExternalVariables.end()) {
        pFunc()->mExternalVariables.push_back(externalVariable);

        return true;
    }

    return false;
}